

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Performance::ShaderCompilerCase::linkAndUseProgram
          (ShaderCompilerCase *this,deUint32 program)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  int local_24;
  long lStack_20;
  GLint linkStatus;
  Functions *gl;
  ShaderCompilerCase *pSStack_10;
  deUint32 program_local;
  ShaderCompilerCase *this_local;
  
  gl._4_4_ = program;
  pSStack_10 = this;
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  (**(code **)(lStack_20 + 0xce8))(gl._4_4_);
  (**(code **)(lStack_20 + 0x9d8))(gl._4_4_,0x8b82,&local_24);
  if (local_24 != 0) {
    (**(code **)(lStack_20 + 0x1680))(gl._4_4_);
  }
  return local_24 != 0;
}

Assistant:

bool ShaderCompilerCase::linkAndUseProgram (deUint32 program) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	GLint linkStatus = 0;

	gl.linkProgram(program);
	gl.getProgramiv(program, GL_LINK_STATUS, &linkStatus);

	if (linkStatus != 0)
		gl.useProgram(program);

	return linkStatus != 0;
}